

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

void __thiscall
ser::Serializer::ReadField
          (Serializer *this,string *fieldName,Savepoint *savepoint,void *pData,int iStride,
          int jStride,int kStride,int lStride,bool alsoPrevious)

{
  OffsetTable *this_00;
  element_type *peVar1;
  uint savepointID;
  StellaOutputProxy *pSVar2;
  DataFieldInfo *pDVar3;
  ostream *poVar4;
  SerializationException *this_01;
  vector<char,_std::allocator<char>_> binaryData;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  void *pData_local;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  ifstream fs;
  char local_228 [504];
  
  if (-1 < enabled_) {
    pData_local = pData;
    stella::detail::StellaOutput::operator<<((StellaOutput *)&binaryData,(char (*) [17])&sout);
    pSVar2 = stella::detail::StellaOutputProxy::operator<<
                       ((StellaOutputProxy *)&binaryData,fieldName);
    pSVar2 = stella::detail::StellaOutputProxy::operator<<(pSVar2,(char (*) [15])0x1740b3);
    Savepoint::ToString_abi_cxx11_((string *)&fs,savepoint);
    pSVar2 = stella::detail::StellaOutputProxy::operator<<(pSVar2,(string *)&fs);
    pSVar2 = stella::detail::StellaOutputProxy::operator<<(pSVar2,(char (*) [15])" into data at ");
    pSVar2 = stella::detail::StellaOutputProxy::operator<<(pSVar2,&pData_local);
    stella::detail::StellaOutputProxy::operator<<(pSVar2,(char (*) [2])0x17229c);
    if (_fs != local_228) {
      operator_delete(_fs);
    }
    pDVar3 = FieldsTable::Find(&this->fieldsTable_,fieldName);
    this_00 = &this->offsetTable_;
    savepointID = OffsetTable::GetSavepointID(this_00,savepoint);
    if ((int)savepointID < 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fs);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fs,"Error: the requested savepoint ",0x1f);
      Savepoint::ToString_abi_cxx11_((string *)&binaryData,savepoint);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&fs,
                          binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," does not exist in the serializer.",0x22);
      if ((pointer *)
          binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          &binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_270;
      binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__SerializationException_0018ea30;
      binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_270._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign
                ((string *)
                 &binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      if (local_258[0] != local_248) {
        operator_delete(local_258[0]);
      }
      this_01 = (SerializationException *)__cxa_allocate_exception(0x28);
      SerializationException::SerializationException(this_01,(SerializationException *)&binaryData);
      __cxa_throw(this_01,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
    if (alsoPrevious) {
      OffsetTable::GetOffset(this_00,savepointID,fieldName);
      stella::detail::StellaOutput::operator<<((StellaOutput *)&fs,(char (*) [26])&sout);
      pSVar2 = stella::detail::StellaOutputProxy::operator<<((StellaOutputProxy *)&fs,savepoint);
      stella::detail::StellaOutputProxy::operator<<(pSVar2,(char (*) [2])0x17229c);
    }
    std::ifstream::ifstream(&fs);
    peVar1 = (this->pFileFormat_).px;
    if (peVar1 == (element_type *)0x0) {
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<ser::FileFormat>::operator->() const [T = ser::FileFormat]"
                   );
    }
    (*peVar1->_vptr_FileFormat[7])
              (peVar1,&fs,fieldName,
               (this_00->savepoints_).
               super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
               super__Vector_impl_data._M_start + savepointID);
    std::vector<char,_std::allocator<char>_>::vector
              (&binaryData,
               (long)pDVar3->lSize_ *
               (long)pDVar3->kSize_ * (long)pDVar3->jSize_ *
               (long)pDVar3->iSize_ * (long)pDVar3->bytesPerElement_,(allocator_type *)local_258);
    std::istream::read((char *)&fs,
                       (long)binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    BinarySerializer::ReadArray
              (&this->binarySerializer_,pData_local,pDVar3->bytesPerElement_,pDVar3->iSize_,
               pDVar3->jSize_,pDVar3->kSize_,pDVar3->lSize_,iStride,jStride,kStride,lStride,
               &binaryData);
    if (binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::ifstream::~ifstream(&fs);
  }
  return;
}

Assistant:

void Serializer::ReadField(const std::string& fieldName, const Savepoint& savepoint,
        void* pData, int iStride, int jStride, int kStride, int lStride, bool alsoPrevious) const
{
    // Don't read if serialization is disabeld
    if (enabled_ < 0) return;

    sout << "Requested field " << fieldName << " at savepoint " << savepoint.ToString()
         << " into data at " << pData << "\n";

    // Retrieve field info
    // (It will throw an exception is the field is not yet registered)
    const DataFieldInfo& info = fieldsTable_.Find(fieldName);

    // Search savepoint
    int savepointID = offsetTable_.GetSavepointID(savepoint);
    if (savepointID < 0)
    {
        // Throw exception
        std::ostringstream errorstr;
        errorstr << "Error: the requested savepoint " << savepoint.ToString()
            << " does not exist in the serializer.";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Search in previous savepoints
    if (alsoPrevious)
    {
        OffsetTable::offset_t offset;
        bool found = false;
        while(!found)
        {
            try
            {
                offsetTable_.GetOffset(savepointID, fieldName);

                // Field is found
                found = true;
                break;
            }
            catch (SerializationException&)
            {
                // Field is not found: proceed with previous savepoint
            }

            if(--savepointID < 0)
                break;
        }

        if (savepointID < 0)
        {
            std::ostringstream errorstr;
            errorstr << "Error: field " << fieldName << " is never serialized "
                     << "at or before savepoint " << savepoint << "\n";
            SerializationException exception;
            exception.Init(errorstr.str());
            throw exception;
        }

        sout << "Field found at savepoint " << savepoint << "\n";
    }

    // Open file stream
    // (This will check if the field is saved at savepoint and throw otherwise)
    std::ifstream fs;
    pFileFormat_->OpenStreamRead(fs, fieldName, offsetTable_.savepoints()[savepointID]);

    // Read data into buffer
    std::vector<char> binaryData(info.dataSize());
    fs.read(binaryData.data(), binaryData.size());

    // Read data into array
    binarySerializer_.ReadArray(pData, info.bytesPerElement(),
            info.iSize(), info.jSize(), info.kSize(), info.lSize(),
            iStride, jStride, kStride, lStride, binaryData);
}